

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O1

ssize_t add_to_tmp_buffer(FFSBuffer buf,size_t size)

{
  long lVar1;
  void *pvVar2;
  long lVar3;
  size_t s;
  ulong s_00;
  
  lVar1 = buf->tmp_buffer_size;
  lVar3 = buf->tmp_buffer_in_use_size;
  s_00 = size + lVar3;
  if (lVar1 < 0) {
    if ((ulong)-lVar1 < s_00) {
      return -1;
    }
  }
  else {
    if (lVar1 == 0) {
      s = 0x400;
      if (0x400 < s_00) {
        s = s_00;
      }
      pvVar2 = ffs_malloc(s);
      buf->tmp_buffer = pvVar2;
    }
    if ((ulong)buf->tmp_buffer_size < s_00) {
      pvVar2 = ffs_realloc(buf->tmp_buffer,s_00);
      buf->tmp_buffer = pvVar2;
      buf->tmp_buffer_size = s_00;
    }
  }
  if (buf->tmp_buffer == (void *)0x0) {
    buf->tmp_buffer_size = 0;
    lVar3 = -1;
  }
  else {
    buf->tmp_buffer_in_use_size = s_00;
  }
  return lVar3;
}

Assistant:

static
ssize_t
add_to_tmp_buffer(FFSBuffer buf, size_t size)
{
    ssize_t old_size = buf->tmp_buffer_in_use_size;
    size += old_size;

    if (buf->tmp_buffer_size < 0) {
	/* fixed size buffer */
	if (size > (size_t)(-buf->tmp_buffer_size)) return -1;
    } else {
	if (buf->tmp_buffer_size == 0) {
	    int64_t tmp_size = Max(size, TMP_BUFFER_INIT_SIZE);
	    buf->tmp_buffer = malloc(tmp_size);
	}
	if (size > (size_t)buf->tmp_buffer_size) {
	    buf->tmp_buffer = realloc(buf->tmp_buffer, size);
	    buf->tmp_buffer_size = size;
	}
    }
    if (!buf->tmp_buffer) {
	buf->tmp_buffer_size = 0;
	return -1;
    } else {
	buf->tmp_buffer_in_use_size = size;
    }

    return old_size;
}